

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::VicinityGroup> *
metaf::VicinityGroup::parse
          (optional<metaf::VicinityGroup> *__return_storage_ptr__,string *group,
          ReportPart reportPart,ReportMetadata *reportMetadata)

{
  _Optional_payload<metaf::VicinityGroup,_true,_true,_true> *p_Var1;
  bool bVar2;
  IncompleteType IVar3;
  IncompleteType IVar4;
  
  bVar2 = false;
  if (reportPart == RMK) {
    bVar2 = std::operator==(group,"TS");
    IVar3 = EXPECT_DIST_DIR1;
    IVar4 = NONE;
    if (!bVar2) {
      bVar2 = std::operator==(group,"CB");
      if (bVar2) {
        IVar4 = EXPECT_CLD;
      }
      else {
        bVar2 = std::operator==(group,"CBMAM");
        IVar3 = EXPECT_DIST_DIR1;
        IVar4 = IVar3;
        if (!bVar2) {
          bVar2 = std::operator==(group,"ACC");
          if (bVar2) {
            IVar4 = EXPECT_DIR2_MOV;
          }
          else {
            bVar2 = std::operator==(group,"TCU");
            if (bVar2) {
              IVar4 = EXPECT_DIR1;
            }
            else {
              bVar2 = std::operator==(group,"SCSL");
              if (bVar2) {
                IVar4 = EXPECT_DIR2;
              }
              else {
                bVar2 = std::operator==(group,"ACSL");
                if (bVar2) {
                  IVar4 = EXPECT_MOV;
                }
                else {
                  bVar2 = std::operator==(group,"CCSL");
                  if (bVar2) {
                    IVar4 = EXPECT_MOVDIR;
                  }
                  else {
                    bVar2 = std::operator==(group,"ROTOR");
                    if (bVar2) {
                      IVar3 = EXPECT_CLD;
                      IVar4 = 8;
                    }
                    else {
                      bVar2 = std::operator==(group,"VIRGA");
                      if (bVar2) {
                        IVar4 = 9;
                      }
                      else {
                        bVar2 = std::operator==(group,"VCSH");
                        if (bVar2) {
                          IVar4 = 10;
                        }
                        else {
                          bVar2 = std::operator==(group,"FOG");
                          IVar4 = 0xb;
                          if ((!bVar2) && (bVar2 = std::operator==(group,"FG"), !bVar2)) {
                            bVar2 = std::operator==(group,"HAZE");
                            IVar4 = 0xe;
                            if ((!bVar2) && (bVar2 = std::operator==(group,"HZ"), !bVar2)) {
                              bVar2 = std::operator==(group,"SMOKE");
                              IVar4 = 0xf;
                              if ((!bVar2) && (bVar2 = std::operator==(group,"FU"), !bVar2)) {
                                bVar2 = std::operator==(group,"BLSN");
                                if (bVar2) {
                                  IVar4 = 0x10;
                                }
                                else {
                                  bVar2 = std::operator==(group,"BLDU");
                                  if (bVar2) {
                                    IVar4 = 0x12;
                                  }
                                  else {
                                    bVar2 = std::operator==(group,"BLSA");
                                    if (bVar2) {
                                      IVar4 = 0x11;
                                    }
                                    else {
                                      bVar2 = std::operator==(group,"MIFG");
                                      if (bVar2) {
                                        IVar4 = 0xc;
                                      }
                                      else {
                                        bVar2 = std::operator==(group,"BCFG");
                                        if (!bVar2) {
                                          bVar2 = false;
                                          goto LAB_00192f4c;
                                        }
                                        IVar4 = 0xd;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    (__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::VicinityGroup>._M_payload._M_value.t = IVar4;
    (__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::VicinityGroup>._M_payload._M_value.dist.distModifier = NONE;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VicinityGroup>._M_payload + 0xc) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::VicinityGroup>._M_payload._M_value.dist.distUnit = METERS;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VicinityGroup>._M_payload + 0x1c) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VicinityGroup>._M_payload + 0x28) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VicinityGroup>._M_payload + 0x34) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VicinityGroup>._M_payload + 0x40) = 0;
    p_Var1 = &(__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>).
              _M_payload;
    *(uint *)((long)&(p_Var1->super__Optional_payload_base<metaf::VicinityGroup>)._M_payload + 0x44)
         = 0;
    *(Type *)((long)&(p_Var1->super__Optional_payload_base<metaf::VicinityGroup>)._M_payload + 0x48)
         = NOT_REPORTED;
    (__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::VicinityGroup>._M_payload._M_value.incompleteType = IVar3;
    bVar2 = true;
  }
LAB_00192f4c:
  (__return_storage_ptr__->super__Optional_base<metaf::VicinityGroup,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::VicinityGroup>._M_engaged = bVar2;
  return __return_storage_ptr__;
}

Assistant:

std::optional<VicinityGroup> VicinityGroup::parse(
	const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void) reportMetadata;
	std::optional<VicinityGroup> notRecognised;
	if (reportPart != ReportPart::RMK) return notRecognised;
	if (group == "TS") return VicinityGroup(Type::THUNDERSTORM);
	if (group == "CB") return VicinityGroup(Type::CUMULONIMBUS);
	if (group == "CBMAM") return VicinityGroup(Type::CUMULONIMBUS_MAMMATUS);
	if (group == "ACC") return VicinityGroup(Type::ALTOCUMULUS_CASTELLANUS);
	if (group == "TCU") return VicinityGroup(Type::TOWERING_CUMULUS);
	if (group == "SCSL") return VicinityGroup(Type::STRATOCUMULUS_STANDING_LENTICULAR);
	if (group == "ACSL") return VicinityGroup(Type::ALTOCUMULUS_STANDING_LENTICULAR);
	if (group == "CCSL") return VicinityGroup(Type::CIRROCUMULUS_STANDING_LENTICULAR);
	if (group == "ROTOR") return VicinityGroup(Type::ROTOR_CLOUD);
	if (group == "VIRGA") return VicinityGroup(Type::VIRGA);
	if (group == "VCSH") return VicinityGroup(Type::PRECIPITATION_IN_VICINITY);
	if (group == "FOG" || group == "FG") return VicinityGroup(Type::FOG);
	if (group == "HAZE" || group == "HZ") return VicinityGroup(Type::HAZE);
	if (group == "SMOKE" || group == "FU") return VicinityGroup(Type::SMOKE);
	if (group == "BLSN") return VicinityGroup(Type::BLOWING_SNOW);
	if (group == "BLDU") return VicinityGroup(Type::BLOWING_DUST);
	if (group == "BLSA") return VicinityGroup(Type::BLOWING_SAND);
	if (group == "MIFG") return VicinityGroup(Type::FOG_SHALLOW);
	if (group == "BCFG") return VicinityGroup(Type::FOG_PATCHES);
	return notRecognised;
}